

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error ps_table_add(PS_Table table,FT_Int idx,void *object,FT_UInt length)

{
  FT_Error FVar1;
  FT_Byte *local_48;
  ulong local_40;
  FT_PtrDist in_offset;
  FT_Offset new_size;
  FT_Error error;
  FT_UInt length_local;
  void *object_local;
  FT_Int idx_local;
  PS_Table table_local;
  
  if ((idx < 0) || (table->max_elems <= idx)) {
    table_local._4_4_ = 6;
  }
  else {
    _error = (FT_Byte *)object;
    if (table->capacity < table->cursor + (ulong)length) {
      in_offset = table->capacity;
      local_40 = (long)object - (long)table->block;
      if (((long)local_40 < 0) || (table->capacity <= local_40)) {
        local_40 = 0xffffffffffffffff;
      }
      for (; (ulong)in_offset < table->cursor + (ulong)length;
          in_offset = ((ulong)in_offset >> 2) + in_offset + 0x400 & 0xfffffffffffffc00) {
      }
      FVar1 = ps_table_realloc(table,in_offset);
      if (FVar1 != 0) {
        return FVar1;
      }
      if (-1 < (long)local_40) {
        _error = table->block + local_40;
      }
    }
    if (table->block == (FT_Byte *)0x0) {
      local_48 = (FT_Byte *)0x0;
    }
    else {
      local_48 = table->block + table->cursor;
    }
    table->elements[idx] = local_48;
    table->lengths[idx] = length;
    memcpy(table->block + table->cursor,_error,(ulong)length);
    table->cursor = (ulong)length + table->cursor;
    table_local._4_4_ = 0;
  }
  return table_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_table_add( PS_Table     table,
                FT_Int       idx,
                const void*  object,
                FT_UInt      length )
  {
    if ( idx < 0 || idx >= table->max_elems )
    {
      FT_ERROR(( "ps_table_add: invalid index\n" ));
      return FT_THROW( Invalid_Argument );
    }

    /* grow the base block if needed */
    if ( table->cursor + length > table->capacity )
    {
      FT_Error    error;
      FT_Offset   new_size = table->capacity;
      FT_PtrDist  in_offset;


      in_offset = (FT_Byte*)object - table->block;
      if ( in_offset < 0 || (FT_Offset)in_offset >= table->capacity )
        in_offset = -1;

      while ( new_size < table->cursor + length )
      {
        /* increase size by 25% and round up to the nearest multiple
           of 1024 */
        new_size += ( new_size >> 2 ) + 1;
        new_size  = FT_PAD_CEIL( new_size, 1024 );
      }

      error = ps_table_realloc( table, new_size );
      if ( error )
        return error;

      if ( in_offset >= 0 )
        object = table->block + in_offset;
    }

    /* add the object to the base block and adjust offset */
    table->elements[idx] = FT_OFFSET( table->block, table->cursor );
    table->lengths [idx] = length;
    FT_MEM_COPY( table->block + table->cursor, object, length );

    table->cursor += length;
    return FT_Err_Ok;
  }